

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::moveRegToStackArg
          (RACFGBuilder *this,InvokeNode *invokeNode,FuncValue *arg,BaseReg *reg)

{
  uint uVar1;
  uint32_t uVar2;
  InstId IVar3;
  Error EVar4;
  undefined8 extraout_RAX;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  Error unaff_EBP;
  InstId IVar8;
  BaseEmitter *this_00;
  byte bVar9;
  uint uVar10;
  bool bVar11;
  Mem stackPtr;
  Operand_ local_58;
  Operand_ local_48;
  Operand_ local_38;
  Operand_ local_28;
  
  uVar1 = arg->_data;
  if ((uVar1 >> 9 & 1) == 0) {
    moveRegToStackArg();
LAB_0014aa34:
    moveRegToStackArg();
    __clang_call_terminate(extraout_RAX);
  }
  local_48._data[1] = (int)uVar1 >> 0xc;
  uVar7 = *(uint *)(*(long *)this + 0x1d8) & 0xf8;
  local_48._signature._bits = uVar7 + 2;
  local_48._baseId = *(uint32_t *)(*(long *)this + 0x1dc);
  local_48._data[0] = 0;
  local_58._signature._bits = 1;
  local_58._baseId = 0xff;
  local_58._data[0] = 0;
  local_58._data[1] = 0;
  local_38._signature._bits = 1;
  local_38._baseId = 0xff;
  local_38._data[0] = 0;
  local_38._data[1] = 0;
  this_00 = *(BaseEmitter **)(this + 8);
  uVar2 = (reg->super_Operand).super_Operand_._baseId;
  if (*(uint *)&this_00[3]._errorHandler <= uVar2 - 0x100) goto LAB_0014aa34;
  bVar9 = *(byte *)(*(long *)(&((this_00[3]._logger)->_options)._indentation +
                             (ulong)(uVar2 - 0x100) * 2 + -3) + 0xd);
  uVar10 = uVar1 & 0xff;
  bVar5 = (byte)uVar1;
  if (0x19 < uVar10 - 0x22) {
    if (uVar10 != 0x46) goto switchD_0014a60d_caseD_2c;
switchD_0014a60d_caseD_2b:
    if (0x31 < (byte)(bVar9 - 0x33)) {
      return 0x19;
    }
    local_48._signature._bits = uVar7 | 0x8000002;
    local_58._baseId = uVar2;
    local_58._signature._bits = 0x10000161;
    bVar11 = this[0x292] == (RACFGBuilder)0x0;
    IVar3 = 0x4b9;
    IVar8 = 0x1c8;
LAB_0014a7a6:
    if (!bVar11) {
      IVar8 = IVar3;
    }
    goto LAB_0014a7a9;
  }
  switch(uVar10) {
  case 0x22:
  case 0x23:
switchD_0014a60d_caseD_22:
    if (9 < (byte)(bVar9 - 0x20)) {
      if (1 < (byte)(bVar9 - 0x31)) goto switchD_0014a60d_caseD_2a;
      local_48._signature._bits = uVar7 | 0x4000002;
      local_58._baseId = uVar2;
      local_58._signature._bits = 0x8000391;
      bVar11 = this[0x292] == (RACFGBuilder)0x0;
      IVar3 = 0x4aa;
      IVar8 = 0x1bc;
      goto LAB_0014a7a6;
    }
    local_48._signature._bits = uVar7 | 0x4000002;
    local_58._signature._bits = 0x4000031;
LAB_0014a6b3:
    local_58._baseId = uVar2;
    break;
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    if ((bVar9 & 0xfe) == 0x24) {
      local_38._signature._bits = 0x2000029;
    }
    else {
      if ((bVar9 & 0xfe) != 0x22) goto switchD_0014a60d_caseD_22;
      local_38._signature._bits = 0x1000019;
    }
    local_38._baseId = uVar2;
    local_48._signature._bits = uVar7 | 0x4000002;
    local_58._baseId = uVar2;
    local_58._signature._bits = 0x4000031;
    EVar4 = BaseEmitter::_emitI(this_00,(uint)((bVar9 - 0x22 & 0xfd) != 0 || (bVar5 & 0xfd) != 0x24)
                                        * 4 + 0x1da,&local_58,&local_38);
    if (EVar4 != 0) {
      return EVar4;
    }
    this_00 = *(BaseEmitter **)(this + 8);
    break;
  case 0x28:
  case 0x29:
    bVar6 = bVar9 & 0xfe;
    if (bVar6 == 0x22) {
      local_38._signature._bits = 0x1000019;
      bVar9 = bVar9 ^ 0x22;
    }
    else {
      if (bVar6 != 0x24) {
        if (bVar6 != 0x26) {
LAB_0014a990:
          if ((bVar9 & 0xfe) != 0x28) {
            if (1 < (byte)(bVar9 - 0x31)) goto switchD_0014a60d_caseD_2b;
            local_48._signature._bits = uVar7 | 0x8000002;
            local_58._baseId = uVar2;
            local_58._signature._bits = 0x8000391;
            bVar11 = this[0x292] == (RACFGBuilder)0x0;
            IVar3 = 0x4c0;
            IVar8 = 0x1d3;
            goto LAB_0014a7a6;
          }
          local_48._signature._bits = uVar7 | 0x8000002;
          local_58._signature._bits = 0x8000039;
          goto LAB_0014a6b3;
        }
        local_38._baseId = uVar2;
        local_38._signature._bits = 0x4000031;
        if ((bVar5 != 0x28) || (IVar8 = 0x1db, bVar9 != 0x26)) {
          local_48._signature._bits = uVar7 | 0x4000002;
          local_58._baseId = uVar2;
          local_58._signature._bits = 0x4000031;
          goto LAB_0014a936;
        }
        goto LAB_0014a876;
      }
      local_38._signature._bits = 0x2000029;
      bVar9 = bVar9 ^ 0x24;
    }
    local_38._baseId = uVar2;
    IVar8 = (uint)(bVar9 != 0 || bVar5 != 0x28) * 4 + 0x1da;
LAB_0014a876:
    if (((this_00->_environment)._arch & k32BitMask) == kUnknown) {
      local_48._signature._bits = uVar7 | 0x8000002;
      local_58._baseId = uVar2;
      local_58._signature._bits = 0x8000039;
      EVar4 = BaseEmitter::_emitI(this_00,IVar8,&local_58,&local_38);
      if (EVar4 != 0) {
        return EVar4;
      }
      EVar4 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),0x1b7,&local_48,&local_58);
      goto LAB_0014a97e;
    }
    local_48._signature._bits = uVar7 | 0x4000002;
    local_58._baseId = uVar2;
    local_58._signature._bits = 0x4000031;
    EVar4 = BaseEmitter::_emitI(this_00,IVar8,&local_58,&local_38);
    if (EVar4 != 0) {
      return EVar4;
    }
    goto LAB_0014a936;
  case 0x2a:
  case 0x3b:
switchD_0014a60d_caseD_2a:
    if (0x31 < (byte)(bVar9 - 0x33)) {
      return 0x19;
    }
    local_48._signature._bits = uVar7 | 0x4000002;
    local_58._baseId = uVar2;
    local_58._signature._bits = 0x10000161;
    bVar11 = this[0x292] == (RACFGBuilder)0x0;
    IVar3 = 0x4c5;
    IVar8 = 0x1d9;
    goto LAB_0014a7a6;
  case 0x2b:
    goto switchD_0014a60d_caseD_2b;
  default:
switchD_0014a60d_caseD_2c:
    uVar7 = uVar1 & 0xff;
    if (0x31 < uVar7 - 0x33) {
      return 0x19;
    }
    if (((reg->super_Operand).super_Operand_._signature._bits & 0xf00) != 0x100) {
      return 0x19;
    }
    local_48._signature._bits =
         (uint)(byte)TypeUtils::_typeData[(ulong)(uVar1 & 0xff) + 0x100] << 0x18 |
         local_48._signature._bits;
    IVar8 = 0x1ba;
    if (this[0x292] != (RACFGBuilder)0x0) {
      IVar8 = 0x4a9;
    }
    if (uVar7 - 0x47 < 10) {
      local_58._signature._bits = 0x10000161;
    }
    else if (uVar7 - 0x51 < 10) {
      local_58._signature._bits = 0x20000169;
    }
    else {
      if (9 < uVar7 - 0x5b) {
        bVar11 = true;
        goto LAB_0014aa17;
      }
      local_58._signature._bits = 0x40000171;
    }
    local_58._baseId = uVar2;
    unaff_EBP = BaseEmitter::_emitI(this_00,IVar8,&local_48,&local_58);
    bVar11 = false;
LAB_0014aa17:
    if (bVar11) {
      return 0x19;
    }
    return unaff_EBP;
  case 0x31:
  case 0x32:
    bVar5 = bVar9 & 0xfe;
    if (bVar5 == 0x22) {
      local_38._signature._bits = 0x1000019;
LAB_0014a83f:
      local_38._baseId = uVar2;
      IVar8 = 0x1de;
      goto LAB_0014a876;
    }
    if (bVar5 == 0x24) {
      local_38._signature._bits = 0x2000029;
      goto LAB_0014a83f;
    }
    if (bVar5 != 0x26) goto LAB_0014a990;
LAB_0014a936:
    EVar4 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),0x1b7,&local_48,&local_58);
    if (EVar4 != 0) {
      return EVar4;
    }
    local_48._data[1] = local_48._data[1] + 4;
    local_28._signature._bits = 4;
    local_28._baseId = 0;
    local_28._data[0] = 0;
    local_28._data[1] = 0;
    EVar4 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),0x17,&local_48,&local_28);
LAB_0014a97e:
    if (EVar4 == 0) {
      return 0;
    }
    return EVar4;
  }
  IVar8 = 0x1b7;
LAB_0014a7a9:
  EVar4 = BaseEmitter::_emitI(this_00,IVar8,&local_48,&local_58);
  return EVar4;
}

Assistant:

Error RACFGBuilder::moveRegToStackArg(InvokeNode* invokeNode, const FuncValue& arg, const BaseReg& reg) noexcept {
  DebugUtils::unused(invokeNode);
  ASMJIT_ASSERT(arg.isStack());

  Mem stackPtr = ptr(_pass->_sp.as<Gp>(), arg.stackOffset());
  Reg r0, r1;

  VirtReg* vr = cc()->virtRegById(reg.id());
  uint32_t registerSize = cc()->registerSize();
  InstId instId = 0;

  TypeId dstTypeId = arg.typeId();
  TypeId srcTypeId = vr->typeId();

  switch (dstTypeId) {
    case TypeId::kInt64:
    case TypeId::kUInt64:
      // Extend BYTE->QWORD (GP).
      if (TypeUtils::isGp8(srcTypeId)) {
        r1.setRegT<RegType::kX86_GpbLo>(reg.id());

        instId = (dstTypeId == TypeId::kInt64 && srcTypeId == TypeId::kInt8) ? Inst::kIdMovsx : Inst::kIdMovzx;
        goto ExtendMovGpXQ;
      }

      // Extend WORD->QWORD (GP).
      if (TypeUtils::isGp16(srcTypeId)) {
        r1.setRegT<RegType::kX86_Gpw>(reg.id());

        instId = (dstTypeId == TypeId::kInt64 && srcTypeId == TypeId::kInt16) ? Inst::kIdMovsx : Inst::kIdMovzx;
        goto ExtendMovGpXQ;
      }

      // Extend DWORD->QWORD (GP).
      if (TypeUtils::isGp32(srcTypeId)) {
        r1.setRegT<RegType::kX86_Gpd>(reg.id());

        instId = Inst::kIdMovsxd;
        if (dstTypeId == TypeId::kInt64 && srcTypeId == TypeId::kInt32)
          goto ExtendMovGpXQ;
        else
          goto ZeroExtendGpDQ;
      }

      // Move QWORD (GP).
      if (TypeUtils::isGp64(srcTypeId)) goto MovGpQ;
      if (TypeUtils::isMmx(srcTypeId)) goto MovMmQ;
      if (TypeUtils::isVec(srcTypeId)) goto MovXmmQ;
      break;

    case TypeId::kInt32:
    case TypeId::kUInt32:
    case TypeId::kInt16:
    case TypeId::kUInt16:
      // DWORD <- WORD (Zero|Sign Extend).
      if (TypeUtils::isGp16(srcTypeId)) {
        bool isDstSigned = dstTypeId == TypeId::kInt16 || dstTypeId == TypeId::kInt32;
        bool isSrcSigned = srcTypeId == TypeId::kInt8  || srcTypeId == TypeId::kInt16;

        r1.setRegT<RegType::kX86_Gpw>(reg.id());
        instId = isDstSigned && isSrcSigned ? Inst::kIdMovsx : Inst::kIdMovzx;
        goto ExtendMovGpD;
      }

      // DWORD <- BYTE (Zero|Sign Extend).
      if (TypeUtils::isGp8(srcTypeId)) {
        bool isDstSigned = dstTypeId == TypeId::kInt16 || dstTypeId == TypeId::kInt32;
        bool isSrcSigned = srcTypeId == TypeId::kInt8  || srcTypeId == TypeId::kInt16;

        r1.setRegT<RegType::kX86_GpbLo>(reg.id());
        instId = isDstSigned && isSrcSigned ? Inst::kIdMovsx : Inst::kIdMovzx;
        goto ExtendMovGpD;
      }
      ASMJIT_FALLTHROUGH;

    case TypeId::kInt8:
    case TypeId::kUInt8:
      if (TypeUtils::isInt(srcTypeId)) goto MovGpD;
      if (TypeUtils::isMmx(srcTypeId)) goto MovMmD;
      if (TypeUtils::isVec(srcTypeId)) goto MovXmmD;
      break;

    case TypeId::kMmx32:
    case TypeId::kMmx64:
      // Extend BYTE->QWORD (GP).
      if (TypeUtils::isGp8(srcTypeId)) {
        r1.setRegT<RegType::kX86_GpbLo>(reg.id());

        instId = Inst::kIdMovzx;
        goto ExtendMovGpXQ;
      }

      // Extend WORD->QWORD (GP).
      if (TypeUtils::isGp16(srcTypeId)) {
        r1.setRegT<RegType::kX86_Gpw>(reg.id());

        instId = Inst::kIdMovzx;
        goto ExtendMovGpXQ;
      }

      if (TypeUtils::isGp32(srcTypeId)) goto ExtendMovGpDQ;
      if (TypeUtils::isGp64(srcTypeId)) goto MovGpQ;
      if (TypeUtils::isMmx(srcTypeId)) goto MovMmQ;
      if (TypeUtils::isVec(srcTypeId)) goto MovXmmQ;
      break;

    case TypeId::kFloat32:
    case TypeId::kFloat32x1:
      if (TypeUtils::isVec(srcTypeId)) goto MovXmmD;
      break;

    case TypeId::kFloat64:
    case TypeId::kFloat64x1:
      if (TypeUtils::isVec(srcTypeId)) goto MovXmmQ;
      break;

    default:
      if (TypeUtils::isVec(dstTypeId) && reg.as<Reg>().isVec()) {
        stackPtr.setSize(TypeUtils::sizeOf(dstTypeId));
        uint32_t vMovInstId = choose(Inst::kIdMovaps, Inst::kIdVmovaps);

        if (TypeUtils::isVec128(dstTypeId))
          r0.setRegT<RegType::kX86_Xmm>(reg.id());
        else if (TypeUtils::isVec256(dstTypeId))
          r0.setRegT<RegType::kX86_Ymm>(reg.id());
        else if (TypeUtils::isVec512(dstTypeId))
          r0.setRegT<RegType::kX86_Zmm>(reg.id());
        else
          break;

        return cc()->emit(vMovInstId, stackPtr, r0);
      }
      break;
  }
  return DebugUtils::errored(kErrorInvalidAssignment);

  // Extend+Move Gp.
ExtendMovGpD:
  stackPtr.setSize(4);
  r0.setRegT<RegType::kX86_Gpd>(reg.id());

  ASMJIT_PROPAGATE(cc()->emit(instId, r0, r1));
  ASMJIT_PROPAGATE(cc()->emit(Inst::kIdMov, stackPtr, r0));
  return kErrorOk;

ExtendMovGpXQ:
  if (registerSize == 8) {
    stackPtr.setSize(8);
    r0.setRegT<RegType::kX86_Gpq>(reg.id());

    ASMJIT_PROPAGATE(cc()->emit(instId, r0, r1));
    ASMJIT_PROPAGATE(cc()->emit(Inst::kIdMov, stackPtr, r0));
  }
  else {
    stackPtr.setSize(4);
    r0.setRegT<RegType::kX86_Gpd>(reg.id());

    ASMJIT_PROPAGATE(cc()->emit(instId, r0, r1));

ExtendMovGpDQ:
    ASMJIT_PROPAGATE(cc()->emit(Inst::kIdMov, stackPtr, r0));
    stackPtr.addOffsetLo32(4);
    ASMJIT_PROPAGATE(cc()->emit(Inst::kIdAnd, stackPtr, 0));
  }
  return kErrorOk;

ZeroExtendGpDQ:
  stackPtr.setSize(4);
  r0.setRegT<RegType::kX86_Gpd>(reg.id());
  goto ExtendMovGpDQ;

MovGpD:
  stackPtr.setSize(4);
  r0.setRegT<RegType::kX86_Gpd>(reg.id());
  return cc()->emit(Inst::kIdMov, stackPtr, r0);

MovGpQ:
  stackPtr.setSize(8);
  r0.setRegT<RegType::kX86_Gpq>(reg.id());
  return cc()->emit(Inst::kIdMov, stackPtr, r0);

MovMmD:
  stackPtr.setSize(4);
  r0.setRegT<RegType::kX86_Mm>(reg.id());
  return cc()->emit(choose(Inst::kIdMovd, Inst::kIdVmovd), stackPtr, r0);

MovMmQ:
  stackPtr.setSize(8);
  r0.setRegT<RegType::kX86_Mm>(reg.id());
  return cc()->emit(choose(Inst::kIdMovq, Inst::kIdVmovq), stackPtr, r0);

MovXmmD:
  stackPtr.setSize(4);
  r0.setRegT<RegType::kX86_Xmm>(reg.id());
  return cc()->emit(choose(Inst::kIdMovss, Inst::kIdVmovss), stackPtr, r0);

MovXmmQ:
  stackPtr.setSize(8);
  r0.setRegT<RegType::kX86_Xmm>(reg.id());
  return cc()->emit(choose(Inst::kIdMovlps, Inst::kIdVmovlps), stackPtr, r0);
}